

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall rw::World::enumerateLights(World *this,Atomic *atomic,WorldLights *lightData)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  LLLink *pLVar6;
  Sphere *b;
  Matrix *pMVar7;
  int iVar8;
  LLLink *pLVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  V3d VVar15;
  
  iVar3 = lightData->numDirectionals;
  iVar4 = lightData->numLocals;
  lightData->numLocals = 0;
  fVar12 = 0.0;
  fVar13 = 0.0;
  lightData->numAmbients = 0;
  (lightData->ambient).red = 0.0;
  (lightData->ambient).green = 0.0;
  (lightData->ambient).blue = 0.0;
  *(undefined8 *)&(lightData->ambient).alpha = 0x3f800000;
  uVar5 = atomic->geometry->flags;
  fVar14 = 0.0;
  iVar8 = 0;
  iVar10 = 0;
  pLVar6 = (this->globalLights).link.next;
  while (pLVar9 = pLVar6, pLVar9 != &(this->globalLights).link) {
    pLVar6 = pLVar9->next;
    if (((ulong)pLVar9[-4].next & 0x10000) != 0) {
      cVar2 = *(char *)((long)&pLVar9[-4].next + 1);
      if (cVar2 == '\x02') {
        uVar1 = *(undefined8 *)((long)&pLVar9[-2].prev + 4);
        fVar12 = fVar12 + (float)uVar1;
        fVar13 = fVar13 + (float)((ulong)uVar1 >> 0x20);
        (lightData->ambient).red = (float32)fVar12;
        (lightData->ambient).green = (float32)fVar13;
        fVar14 = fVar14 + *(float *)((long)&pLVar9[-1].next + 4);
        (lightData->ambient).blue = (float32)fVar14;
        iVar8 = iVar8 + 1;
        lightData->numAmbients = iVar8;
      }
      else if ((((uVar5 & 0x10) != 0) && (cVar2 == '\x01')) && (iVar10 < iVar3)) {
        lVar11 = (long)iVar10;
        iVar10 = iVar10 + 1;
        lightData->numDirectionals = iVar10;
        lightData->directionals[lVar11] = (Light *)(pLVar9 + -4);
      }
    }
  }
  if ((atomic->world == this) && ((uVar5 & 0x10) != 0)) {
    pLVar6 = (this->localLights).link.next;
    while ((pLVar9 = pLVar6, pLVar9 != &(this->localLights).link && (lightData->numLocals < iVar4)))
    {
      pLVar6 = pLVar9->next;
      if (((ulong)pLVar9[-4].next & 0x10000) != 0) {
        b = Atomic::getWorldBoundingSphere(atomic);
        pMVar7 = Frame::getLTM((Frame *)pLVar9[-4].prev);
        VVar15 = sub(&pMVar7->pos,&b->center);
        if (SQRT((float)VVar15.z * (float)VVar15.z +
                 (float)VVar15.x * (float)VVar15.x + (float)VVar15.y * (float)VVar15.y) <
            (float)b->radius + *(float *)&pLVar9[-2].prev) {
          iVar3 = lightData->numLocals;
          lightData->numLocals = iVar3 + 1;
          lightData->locals[iVar3] = (Light *)(pLVar9 + -4);
        }
      }
    }
  }
  return;
}

Assistant:

void
World::enumerateLights(Atomic *atomic, WorldLights *lightData)
{
	int32 maxDirectionals, maxLocals;

	maxDirectionals = lightData->numDirectionals;
	maxLocals = lightData->numLocals;

	lightData->numDirectionals = 0;
	lightData->numLocals = 0;
	lightData->numAmbients = 0;
	lightData->ambient.red = 0.0f;
	lightData->ambient.green = 0.0f;
	lightData->ambient.blue = 0.0f;
	lightData->ambient.alpha = 1.0f;

	bool32 normals = atomic->geometry->flags & Geometry::NORMALS;

	FORLIST(lnk, this->globalLights){
		Light *l = Light::fromWorld(lnk);
		if((l->getFlags() & Light::LIGHTATOMICS) == 0)
			continue;
		if(l->getType() == Light::AMBIENT){
			lightData->ambient.red   += l->color.red;
			lightData->ambient.green += l->color.green;
			lightData->ambient.blue  += l->color.blue;
			lightData->numAmbients++;
		}else if(normals && l->getType() == Light::DIRECTIONAL){
			if(lightData->numDirectionals < maxDirectionals)
				lightData->directionals[lightData->numDirectionals++] = l;
		}
	}

	if(atomic->world != this)
		return;

	if(!normals)
		return;

	// TODO: for this we would use an atomic's world sectors, but we don't have those yet
	FORLIST(lnk, this->localLights){
		if(lightData->numLocals >= maxLocals)
			return;

		Light *l = Light::fromWorld(lnk);
		if((l->getFlags() & Light::LIGHTATOMICS) == 0)
			continue;

		// check if spheres are intersecting
		Sphere *atomsphere = atomic->getWorldBoundingSphere();
		V3d dist = sub(l->getFrame()->getLTM()->pos, atomsphere->center);
		if(length(dist) < atomsphere->radius + l->radius)
			lightData->locals[lightData->numLocals++] = l;
	}
}